

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcess.c
# Opt level: O1

void main_cold_6(void)

{
  fwrite("Output before sleep on stdout from timeout test.\n",0x31,1,_stdout);
  fwrite("Output before sleep on stderr from timeout test.\n",0x31,1,_stderr);
  fflush(_stdout);
  fflush(_stderr);
  sleep(0xf);
  fwrite("Output after sleep on stdout from timeout test.\n",0x30,1,_stdout);
  fwrite("Output after sleep on stderr from timeout test.\n",0x30,1,_stderr);
  return;
}

Assistant:

static int test3(int argc, const char* argv[])
{
  (void)argc; (void)argv;
  fprintf(stdout, "Output before sleep on stdout from timeout test.\n");
  fprintf(stderr, "Output before sleep on stderr from timeout test.\n");
  fflush(stdout);
  fflush(stderr);
#if defined(_WIN32)
  Sleep(15000);
#else
  sleep(15);
#endif
  fprintf(stdout, "Output after sleep on stdout from timeout test.\n");
  fprintf(stderr, "Output after sleep on stderr from timeout test.\n");
  return 0;
}